

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::MakeCurrentPerfCase::iterate(MakeCurrentPerfCase *this)

{
  EGLDisplay pvVar1;
  pointer ppvVar2;
  deUint32 dVar3;
  Library *pLVar4;
  deUint64 dVar5;
  deUint64 dVar6;
  int iteration;
  int iVar7;
  bool bVar8;
  unsigned_long local_38;
  
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  if ((this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_samples).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    logTestInfo(this);
  }
  pvVar1 = this->m_display;
  dVar5 = deGetMicroseconds();
  for (iVar7 = 0; iVar7 < (this->m_spec).iterationCount; iVar7 = iVar7 + 1) {
    deRandom_getUint32(&(this->m_rnd).m_rnd);
    dVar3 = deRandom_getUint32(&(this->m_rnd).m_rnd);
    ppvVar2 = (this->m_surfaces).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    (*pLVar4->_vptr_Library[0x27])
              (pLVar4,pvVar1,
               ppvVar2[(ulong)dVar3 %
                       (ulong)((long)(this->m_surfaces).
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3)]);
    if ((this->m_spec).release == true) {
      (*pLVar4->_vptr_Library[0x27])(pLVar4,pvVar1,0);
    }
  }
  dVar6 = deGetMicroseconds();
  local_38 = dVar6 - dVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_samples,&local_38);
  (*pLVar4->_vptr_Library[0x27])(pLVar4,pvVar1,0,0,0);
  dVar3 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(dVar3,"eglMakeCurrent()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0x214);
  bVar8 = (this->m_spec).sampleCount !=
          (int)((ulong)((long)(this->m_samples).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_samples).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (!bVar8) {
    logResults(this);
  }
  return (uint)bVar8;
}

Assistant:

TestCase::IterateResult MakeCurrentPerfCase::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	if (m_samples.size() == 0)
		logTestInfo();

	{
		EGLDisplay	display		= m_display;
		deUint64	beginTimeUs	= deGetMicroseconds();

		for (int iteration = 0; iteration < m_spec.iterationCount; iteration++)
		{
			EGLContext	context = m_contexts[m_rnd.getUint32() % m_contexts.size()];
			EGLSurface	surface	= m_surfaces[m_rnd.getUint32() % m_surfaces.size()];

			egl.makeCurrent(display, surface, surface, context);

			if (m_spec.release)
				egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		}

		m_samples.push_back(deGetMicroseconds() - beginTimeUs);

		egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent()");
	}

	if ((int)m_samples.size() == m_spec.sampleCount)
	{
		logResults();
		return STOP;
	}
	else
		return CONTINUE;
}